

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

Embed * __thiscall discordpp::Embed::operator=(Embed *this,Embed *param_1)

{
  Embed *param_1_local;
  Embed *this_local;
  
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=(&this->title,&param_1->title);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=(&this->type,&param_1->type);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=(&this->description,&param_1->description);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=(&this->url,&param_1->url);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=(&this->timestamp,&param_1->timestamp);
  omittable_field<int>::operator=(&this->color,&param_1->color);
  omittable_field<discordpp::EmbedFooter>::operator=(&this->footer,&param_1->footer);
  omittable_field<discordpp::EmbedImage>::operator=(&this->image,&param_1->image);
  omittable_field<discordpp::EmbedThumbnail>::operator=(&this->thumbnail,&param_1->thumbnail);
  omittable_field<discordpp::EmbedVideo>::operator=(&this->video,&param_1->video);
  omittable_field<discordpp::EmbedProvider>::operator=(&this->provider,&param_1->provider);
  omittable_field<discordpp::EmbedAuthor>::operator=(&this->author,&param_1->author);
  omittable_field<std::vector<discordpp::EmbedField,_std::allocator<discordpp::EmbedField>_>_>::
  operator=(&this->fields,&param_1->fields);
  return this;
}

Assistant:

Embed(
        omittable_field<std::string> title = omitted,
        omittable_field<std::string> type = omitted,
        omittable_field<std::string> description = omitted,
        omittable_field<std::string> url = omitted,
        omittable_field<Timestamp> timestamp = omitted,
        omittable_field<int> color = omitted,
        omittable_field<EmbedFooter> footer = omitted,
        omittable_field<EmbedImage> image = omitted,
        omittable_field<EmbedThumbnail> thumbnail = omitted,
        omittable_field<EmbedVideo> video = omitted,
        omittable_field<EmbedProvider> provider = omitted,
        omittable_field<EmbedAuthor> author = omitted,
        omittable_field<std::vector<EmbedField> > fields = omitted
    ):
        title(title),
        type(type),
        description(description),
        url(url),
        timestamp(timestamp),
        color(color),
        footer(footer),
        image(image),
        thumbnail(thumbnail),
        video(video),
        provider(provider),
        author(author),
        fields(fields)
    {}